

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O0

void uc_init_aarch64(uc_struct_conflict1 *uc)

{
  uc_struct_conflict1 *uc_local;
  
  uc->reg_read_arm = reg_read_aarch64;
  uc->reg_write_arm = reg_write_aarch64;
  uc->reg_reset = reg_reset;
  uc->set_pc = arm64_set_pc;
  uc->get_pc = arm64_get_pc;
  uc->release = arm64_release;
  uc->cpus_init = arm64_cpus_init;
  uc->cpu_context_size = 0x3138;
  uc_common_init(uc);
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->set_pc = arm64_set_pc;
    uc->get_pc = arm64_get_pc;
    uc->release = arm64_release;
    uc->cpus_init = arm64_cpus_init;
    uc->cpu_context_size = offsetof(CPUARMState, cpu_watchpoint);
    uc_common_init(uc);
}